

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  sel_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int64_t *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int64_t lmicros;
  int64_t ldays;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar15 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar15 = 0;
    lVar19 = 0;
    uVar7 = 0;
    uVar13 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[uVar7];
      }
      uVar16 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar16 = count;
      }
      uVar14 = uVar13;
      if (uVar10 == 0xffffffffffffffff) {
        if (uVar13 < uVar16) {
          psVar2 = sel->sel_vector;
          lVar9 = ldata->micros;
          lVar12 = (long)ldata->days + lVar9 / 86400000000;
          lVar8 = lVar12 % 0x1e;
          lVar12 = (long)ldata->months + lVar12 / 0x1e;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar11 = &rdata[uVar13].micros;
          do {
            uVar10 = uVar13;
            if (psVar2 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar2[uVar13];
            }
            lVar18 = (long)*(int32_t *)((long)piVar11 + -4) + *piVar11 / 86400000000;
            lVar17 = (long)((interval_t *)(piVar11 + -1))->months + lVar18 / 0x1e;
            bVar5 = true;
            if (lVar12 <= lVar17) {
              if (lVar12 < lVar17) {
                bVar5 = false;
              }
              else {
                lVar18 = lVar18 % 0x1e;
                if (lVar8 <= lVar18) {
                  bVar5 = *piVar11 % 86400000000 < lVar9 % 86400000000 && lVar18 <= lVar8;
                }
              }
            }
            psVar3[iVar15] = (sel_t)uVar10;
            iVar15 = iVar15 + bVar5;
            psVar4[lVar19] = (sel_t)uVar10;
            lVar19 = lVar19 + (ulong)(bVar5 ^ 1);
            uVar13 = uVar13 + 1;
            piVar11 = piVar11 + 2;
            uVar14 = uVar13;
          } while (uVar16 != uVar13);
        }
      }
      else if (uVar10 == 0) {
        uVar14 = uVar16;
        if (uVar13 < uVar16) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar6 = (sel_t)uVar13;
            if (psVar2 != (sel_t *)0x0) {
              sVar6 = psVar2[uVar13];
            }
            psVar3[lVar19] = sVar6;
            lVar19 = lVar19 + 1;
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
        }
      }
      else if (uVar13 < uVar16) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        piVar11 = &rdata[uVar13].micros;
        uVar14 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar6 = (int)uVar13 + (int)uVar14;
          }
          else {
            sVar6 = psVar2[uVar13 + uVar14];
          }
          if ((uVar10 >> (uVar14 & 0x3f) & 1) == 0) {
            bVar5 = false;
          }
          else {
            lVar18 = (long)ldata->days + ldata->micros / 86400000000;
            lVar8 = (long)ldata->months + lVar18 / 0x1e;
            lVar9 = (long)*(int32_t *)((long)piVar11 + -4) + *piVar11 / 86400000000;
            lVar12 = (long)((interval_t *)(piVar11 + -1))->months + lVar9 / 0x1e;
            bVar5 = true;
            if (lVar8 <= lVar12) {
              if (lVar8 < lVar12) {
                bVar5 = false;
              }
              else {
                lVar18 = lVar18 % 0x1e;
                lVar9 = lVar9 % 0x1e;
                bVar5 = true;
                if (lVar18 <= lVar9) {
                  bVar5 = *piVar11 % 86400000000 < ldata->micros % 86400000000 && lVar9 <= lVar18;
                }
              }
            }
          }
          psVar3[iVar15] = sVar6;
          iVar15 = iVar15 + bVar5;
          psVar4[lVar19] = sVar6;
          lVar19 = (ulong)(bVar5 ^ 1) + lVar19;
          uVar14 = uVar14 + 1;
          piVar11 = piVar11 + 2;
        } while ((uVar13 - uVar16) + uVar14 != 0);
        uVar14 = uVar13 + uVar14;
      }
      uVar7 = uVar7 + 1;
      uVar13 = uVar14;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar15;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}